

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fitscore.c
# Opt level: O2

int fftrec(char *card,int *status)

{
  char cVar1;
  int iVar2;
  size_t sVar3;
  ulong uVar4;
  char *__src;
  char msg [81];
  
  iVar2 = *status;
  if (iVar2 < 1) {
    sVar3 = strlen(card);
    for (uVar4 = 8; uVar4 < sVar3; uVar4 = uVar4 + 1) {
      if ((byte)(card[uVar4] + 0x81U) < 0xa1) {
        snprintf(msg,0x51,"Character %d in this keyword is illegal. Hex Value = %X",
                 (ulong)((int)uVar4 + 1));
        cVar1 = card[uVar4];
        switch(cVar1) {
        case '\0':
          __src = " (NULL char.)";
          break;
        case '\x01':
        case '\x02':
        case '\x03':
        case '\x04':
        case '\x05':
        case '\x06':
        case '\a':
        case '\b':
          goto switchD_00174a47_caseD_1;
        case '\t':
          __src = " (TAB char.)";
          break;
        case '\n':
          __src = " (Line Feed char.)";
          break;
        case '\v':
          __src = " (Vertical Tab)";
          break;
        case '\f':
          __src = " (Form Feed char.)";
          break;
        case '\r':
          __src = " (Carriage Return)";
          break;
        default:
          if (cVar1 == '\x1b') {
            __src = " (Escape char.)";
          }
          else {
            if (cVar1 != '\x7f') goto switchD_00174a47_caseD_1;
            __src = " (Delete char.)";
          }
        }
        sVar3 = strlen(msg);
        strncat(msg,__src,0x50 - sVar3);
switchD_00174a47_caseD_1:
        ffpmsg(msg);
        strncpy(msg,card,0x50);
        msg[0x50] = '\0';
        ffpmsg(msg);
        *status = 0xcf;
        return 0xcf;
      }
    }
  }
  return iVar2;
}

Assistant:

int fftrec(char *card,       /* I -  keyword card to test */
           int *status)      /* IO - error status */
/*
  Test that the keyword card conforms to the FITS standard.  Must contain
  only printable ASCII characters;
*/
{
    size_t ii, maxchr;
    char msg[FLEN_ERRMSG];

    if (*status > 0)           /* inherit input status value if > 0 */
        return(*status);

    maxchr = strlen(card);

    for (ii = 8; ii < maxchr; ii++)
    {
        if (card[ii] < 32 || card[ii] > 126)
        {
            snprintf(msg, FLEN_ERRMSG, 
           "Character %d in this keyword is illegal. Hex Value = %X",
              (int) (ii+1), (int) card[ii] );

            if (card[ii] == 0)
	        strncat(msg, " (NULL char.)",FLEN_ERRMSG-strlen(msg)-1);
            else if (card[ii] == 9)
	        strncat(msg, " (TAB char.)",FLEN_ERRMSG-strlen(msg)-1);
            else if (card[ii] == 10)
	        strncat(msg, " (Line Feed char.)",FLEN_ERRMSG-strlen(msg)-1);
            else if (card[ii] == 11)
	        strncat(msg, " (Vertical Tab)",FLEN_ERRMSG-strlen(msg)-1);
            else if (card[ii] == 12)
	        strncat(msg, " (Form Feed char.)",FLEN_ERRMSG-strlen(msg)-1);
            else if (card[ii] == 13)
	        strncat(msg, " (Carriage Return)",FLEN_ERRMSG-strlen(msg)-1);
            else if (card[ii] == 27)
	        strncat(msg, " (Escape char.)",FLEN_ERRMSG-strlen(msg)-1);
            else if (card[ii] == 127)
	        strncat(msg, " (Delete char.)",FLEN_ERRMSG-strlen(msg)-1);

            ffpmsg(msg);

            strncpy(msg, card, 80);
            msg[80] = '\0';
            ffpmsg(msg);
            return(*status = BAD_KEYCHAR);        
        }
    }
    return(*status);        
}